

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void term(item *x)

{
  int iVar1;
  item *x_00;
  
  x_00 = (item *)calloc(1,0x30);
  factor(x);
  while( true ) {
    iVar1 = currentSymbol;
    if (((9 < currentSymbol - 99U) || ((0x203U >> (currentSymbol - 99U & 0x1f) & 1) == 0)) &&
       (currentSymbol != 0xca)) break;
    getSymbol();
    if (iVar1 == 0xca) {
      opOne(0xca,x);
      factor(x_00);
      opTwo(0xca,x,x_00);
      iVar1 = x_00->r;
      if (x->r != iVar1) {
        regs[x->r] = 0;
        x->r = iVar1;
      }
    }
    else {
      factor(x_00);
      opTwo(iVar1,x,x_00);
    }
  }
  return;
}

Assistant:

procedure 
void term(struct item *x) {
	variable struct item *y;
	variable int op;
	op = 0; y = NULL;
	allocMem(y);
	factor(x);
	while ((currentSymbol == SYMBOL_MUL) || (currentSymbol == SYMBOL_DIV) || 
		(currentSymbol == SYMBOL_AND) ||
		(currentSymbol == SYMBOL_MOD)) {
			op = currentSymbol;
			getSymbol();
			if (op == SYMBOL_AND) {
				opOne(op,x);
			}
			factor(y);
			opTwo(op,x,y);
			if (op == SYMBOL_AND) {
				if(x->r != y->r) {
					regs[x->r] = 0;
					x->r = y->r;
				}
			}
		}
}